

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int lookupName(Parse *pParse,char *zDb,char *zTab,char *zCol,NameContext *pNC,Expr *pExpr)

{
  short sVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  SrcList *pSVar4;
  Table *pTVar5;
  Select *pSVar6;
  IdList *pIVar7;
  ExprList *pEList;
  bool bVar8;
  bool bVar9;
  ynVar yVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int nSubquery;
  Table **ppTVar14;
  ushort uVar15;
  ulong uVar16;
  ulong uVar17;
  Column *pCVar18;
  char *pcVar19;
  u8 uVar20;
  long lVar21;
  uchar uVar22;
  long lVar23;
  Schema **ppSVar24;
  byte *pbVar25;
  SrcList_item *pSVar26;
  byte *pbVar27;
  byte bVar28;
  uchar uVar29;
  int iVar30;
  uint uVar31;
  char **ppcVar32;
  byte *pbVar33;
  uint uVar34;
  bool bVar35;
  SrcList_item *local_a8;
  NameContext *local_78;
  Schema *local_70;
  
  psVar3 = pParse->db;
  pExpr->iTable = -1;
  pExpr->pTab = (Table *)0x0;
  if (zDb == (char *)0x0) {
    local_70 = (Schema *)0x0;
  }
  else if ((long)psVar3->nDb < 1) {
    local_70 = (Schema *)0x0;
  }
  else {
    local_70 = (Schema *)0x0;
    lVar23 = 0;
    do {
      pbVar25 = (byte *)psVar3->aDb[lVar23].zName;
      bVar28 = *pbVar25;
      pbVar33 = (byte *)zDb;
      while (bVar28 != 0) {
        uVar16 = (ulong)bVar28;
        pbVar25 = pbVar25 + 1;
        if (""[uVar16] != ""[*pbVar33]) goto LAB_0018596e;
        pbVar33 = pbVar33 + 1;
        bVar28 = *pbVar25;
      }
      uVar16 = 0;
LAB_0018596e:
      if (""[uVar16] == ""[*pbVar33]) {
        local_70 = psVar3->aDb[lVar23].pSchema;
        break;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != psVar3->nDb);
  }
  if (pNC == (NameContext *)0x0) {
    uVar20 = 0x98;
    local_a8 = (SrcList_item *)0x0;
    bVar9 = false;
    if (zTab == (char *)0x0) {
      bVar35 = true;
      bVar8 = true;
      local_a8 = (SrcList_item *)0x0;
      local_78 = (NameContext *)0x0;
      bVar9 = false;
LAB_0018615a:
      if ((pExpr->flags & 0x40) != 0) {
        pExpr->op = '^';
        pExpr->pTab = (Table *)0x0;
        return 1;
      }
LAB_0018619a:
      pcVar19 = "ambiguous column name";
      if (bVar8) {
        pcVar19 = "no such column";
      }
    }
    else {
      pcVar19 = "no such column";
      local_78 = (NameContext *)0x0;
      bVar35 = false;
    }
    if (zDb == (char *)0x0) {
      if (bVar35) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar19,zCol);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar19,zTab,zCol);
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar19,zDb,zTab,zCol);
    }
    pParse->checkSchema = '\x01';
    pNC->nErr = pNC->nErr + 1;
  }
  else {
    iVar13 = 0;
    nSubquery = 0;
    local_a8 = (SrcList_item *)0x0;
    bVar35 = false;
    local_78 = pNC;
    do {
      pSVar4 = local_78->pSrcList;
      if (pSVar4 == (SrcList *)0x0) {
        iVar12 = 0;
      }
      else {
        sVar1 = pSVar4->nSrc;
        if (sVar1 < 1) {
          iVar12 = 0;
        }
        else {
          pSVar26 = pSVar4->a;
          iVar30 = 0;
          iVar12 = 0;
          do {
            pTVar5 = pSVar26->pTab;
            pSVar6 = pSVar26->pSelect;
            if ((pSVar6 == (Select *)0x0) || ((pSVar6->selFlags & 0x200) == 0)) {
LAB_00185b0d:
              if ((zDb == (char *)0x0) || (pTVar5->pSchema == local_70)) {
                if (zTab != (char *)0x0) {
                  pbVar25 = (byte *)pSVar26->zAlias;
                  if (pbVar25 == (byte *)0x0) {
                    pbVar25 = (byte *)pTVar5->zName;
                  }
                  bVar28 = *pbVar25;
                  pbVar33 = (byte *)zTab;
                  if (bVar28 == 0) {
                    uVar16 = 0;
                  }
                  else {
                    do {
                      uVar16 = (ulong)bVar28;
                      pbVar25 = pbVar25 + 1;
                      if (""[uVar16] != ""[*pbVar33]) goto LAB_00185b6d;
                      pbVar33 = pbVar33 + 1;
                      bVar28 = *pbVar25;
                    } while (bVar28 != 0);
                    uVar16 = 0;
                  }
LAB_00185b6d:
                  if (""[uVar16] != ""[*pbVar33]) goto LAB_00185cef;
                }
                iVar11 = iVar13 + 1;
                if (iVar13 == 0) {
                  local_a8 = pSVar26;
                }
                iVar13 = iVar11;
                if (0 < pTVar5->nCol) {
                  pCVar18 = pTVar5->aCol;
                  iVar11 = 0;
                  do {
                    pbVar25 = (byte *)pCVar18->zName;
                    bVar28 = *pbVar25;
                    pbVar33 = (byte *)zCol;
                    while (bVar28 != 0) {
                      uVar16 = (ulong)bVar28;
                      pbVar25 = pbVar25 + 1;
                      if (""[uVar16] != ""[*pbVar33]) goto LAB_00185bea;
                      pbVar33 = pbVar33 + 1;
                      bVar28 = *pbVar25;
                    }
                    uVar16 = 0;
LAB_00185bea:
                    if (""[uVar16] == ""[*pbVar33]) {
                      if (iVar12 == 1) {
                        if ((pSVar26->jointype & 4) != 0) goto LAB_00185c92;
                        pIVar7 = pSVar26->pUsing;
                        if ((pIVar7 != (IdList *)0x0) && (0 < (long)pIVar7->nId)) {
                          lVar23 = 0;
                          do {
                            pbVar25 = (byte *)pIVar7->a[lVar23].zName;
                            bVar28 = *pbVar25;
                            if (bVar28 == 0) {
                              if (*zCol == '\0') goto LAB_00185c92;
                            }
                            else {
                              lVar21 = 0;
                              do {
                                uVar29 = ""[bVar28];
                                uVar22 = ""[(byte)zCol[lVar21]];
                                if (uVar29 != uVar22) goto LAB_00185c7a;
                                bVar28 = pbVar25[lVar21 + 1];
                                lVar21 = lVar21 + 1;
                              } while (bVar28 != 0);
                              uVar22 = ""[(byte)zCol[lVar21]];
                              uVar29 = '\0';
LAB_00185c7a:
                              if (uVar29 == uVar22) goto LAB_00185c92;
                            }
                            lVar23 = lVar23 + 1;
                            if (lVar23 == pIVar7->nId) break;
                          } while( true );
                        }
                      }
                      iVar12 = iVar12 + 1;
                      yVar10 = (ynVar)iVar11;
                      if (iVar11 == pTVar5->iPKey) {
                        yVar10 = -1;
                      }
                      pExpr->iColumn = yVar10;
                      local_a8 = pSVar26;
                      break;
                    }
LAB_00185c92:
                    iVar11 = iVar11 + 1;
                    pCVar18 = pCVar18 + 1;
                  } while (iVar11 != pTVar5->nCol);
                }
              }
            }
            else {
              lVar23 = (long)pSVar6->pEList->nExpr;
              if (lVar23 < 1) {
                bVar8 = true;
              }
              else {
                ppcVar32 = &pSVar6->pEList->a->zSpan;
                lVar21 = 0;
                bVar8 = false;
                do {
                  iVar11 = sqlite3MatchSpanName(*ppcVar32,zCol,zTab,zDb);
                  if (iVar11 != 0) {
                    iVar12 = iVar12 + 1;
                    pExpr->iColumn = (ynVar)lVar21;
                    iVar13 = 2;
                    bVar8 = true;
                    local_a8 = pSVar26;
                  }
                  lVar21 = lVar21 + 1;
                  ppcVar32 = ppcVar32 + 4;
                } while (lVar23 != lVar21);
                bVar8 = !bVar8;
              }
              if (!(bool)(bVar8 ^ 1U | zTab == (char *)0x0)) goto LAB_00185b0d;
            }
LAB_00185cef:
            iVar30 = iVar30 + 1;
            pSVar26 = pSVar26 + 1;
          } while (iVar30 != sVar1);
        }
        if (local_a8 == (SrcList_item *)0x0) {
          local_a8 = (SrcList_item *)0x0;
        }
        else {
          pExpr->iTable = local_a8->iCursor;
          pTVar5 = local_a8->pTab;
          pExpr->pTab = pTVar5;
          local_70 = pTVar5->pSchema;
        }
      }
      if (iVar12 == 0 && (zTab != (char *)0x0 && zDb == (char *)0x0)) {
        pTVar5 = pParse->pTriggerTab;
        if (pTVar5 == (Table *)0x0) {
          iVar12 = 0;
          goto LAB_00185f35;
        }
        if (pParse->eTriggerOp == 'j') {
LAB_00185d6f:
          uVar16 = 0x6f;
          lVar23 = 0;
          do {
            uVar29 = ""[uVar16];
            uVar22 = ""[(byte)zTab[lVar23]];
            if (uVar29 != uVar22) goto LAB_00185dac;
            uVar16 = (ulong)(byte)"old"[lVar23 + 1];
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
          uVar22 = ""[(byte)zTab[3]];
          uVar29 = '\0';
LAB_00185dac:
          iVar12 = 0;
          bVar8 = true;
          if (uVar29 != uVar22) {
            iVar12 = 0;
            goto LAB_00185f35;
          }
        }
        else {
          uVar16 = 0x6e;
          lVar23 = 0;
          do {
            uVar29 = ""[uVar16 & 0xff];
            uVar22 = ""[(byte)zTab[lVar23]];
            if (uVar29 != uVar22) goto LAB_00185e06;
            uVar16 = CONCAT71(0x1ac5,"new"[lVar23 + 1]);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
          uVar22 = ""[(byte)zTab[3]];
          uVar29 = '\0';
LAB_00185e06:
          iVar12 = 0;
          if (uVar29 != uVar22) {
            if (pParse->eTriggerOp == 'i') goto LAB_00185f35;
            goto LAB_00185d6f;
          }
          iVar12 = 1;
          bVar8 = false;
        }
        pExpr->iTable = iVar12;
        local_70 = pTVar5->pSchema;
        uVar31 = (uint)pTVar5->nCol;
        if (pTVar5->nCol < 1) {
          uVar34 = 0;
LAB_00185ec6:
          if ((int)uVar31 <= (int)uVar34) goto LAB_00185ecb;
        }
        else {
          uVar16 = 0;
          do {
            pbVar25 = (byte *)pTVar5->aCol[uVar16].zName;
            bVar28 = *pbVar25;
            pbVar33 = (byte *)zCol;
            while (bVar28 != 0) {
              uVar17 = (ulong)bVar28;
              pbVar25 = pbVar25 + 1;
              if (""[uVar17] != ""[*pbVar33]) goto LAB_00185e83;
              pbVar33 = pbVar33 + 1;
              bVar28 = *pbVar25;
            }
            uVar17 = 0;
LAB_00185e83:
            if (""[uVar17] == ""[*pbVar33]) {
              uVar34 = (uint)uVar16;
              if (uVar16 == (long)pTVar5->iPKey) {
                uVar34 = 0xffffffff;
              }
              goto LAB_00185ec6;
            }
            uVar16 = uVar16 + 1;
            uVar34 = uVar31;
          } while (uVar16 != uVar31);
LAB_00185ecb:
          iVar12 = sqlite3IsRowid(zCol);
          uVar34 = uVar34 | -(uint)(iVar12 != 0);
        }
        iVar13 = iVar13 + 1;
        if ((int)uVar31 <= (int)uVar34) {
          iVar12 = 0;
          goto LAB_00185f35;
        }
        if ((int)uVar34 < 0) {
          pExpr->affinity = 'd';
        }
        else {
          uVar31 = 1 << ((byte)uVar34 & 0x1f);
          if (0x1f < uVar34) {
            uVar31 = 0xffffffff;
          }
          if (bVar8) {
            pParse->oldmask = pParse->oldmask | uVar31;
          }
          else {
            pParse->newmask = pParse->newmask | uVar31;
          }
        }
        pExpr->iColumn = (ynVar)uVar34;
        pExpr->pTab = pTVar5;
        bVar35 = true;
        iVar12 = 1;
      }
      else {
LAB_00185f35:
        if ((iVar12 == 0) && (iVar13 == 1)) {
          iVar13 = sqlite3IsRowid(zCol);
          if (iVar13 == 0) {
            iVar12 = 0;
            iVar13 = 1;
          }
          else {
            pExpr->iColumn = -1;
            pExpr->affinity = 'd';
            iVar13 = 1;
            iVar12 = 1;
          }
        }
      }
      if ((zTab == (char *)0x0) && (pEList = local_78->pEList, pEList != (ExprList *)0x0)) {
        if ((iVar12 == 0) || ((local_78->ncFlags & 0x10) == 0)) {
          if (0 < (long)pEList->nExpr) {
            lVar23 = 0;
            do {
              pbVar25 = (byte *)pEList->a[lVar23].zName;
              if (pbVar25 != (byte *)0x0) {
                bVar28 = *pbVar25;
                pbVar27 = (byte *)zCol;
                pbVar33 = pbVar25;
                if (bVar28 == 0) {
                  uVar16 = 0;
                }
                else {
                  do {
                    uVar16 = (ulong)bVar28;
                    if (""[uVar16] != ""[*pbVar27]) goto LAB_00186047;
                    pbVar27 = pbVar27 + 1;
                    bVar28 = pbVar33[1];
                    pbVar33 = pbVar33 + 1;
                  } while (bVar28 != 0);
                  uVar16 = 0;
                }
LAB_00186047:
                if (""[uVar16] == ""[*pbVar27]) {
                  if (((local_78->ncFlags & 1) == 0) &&
                     (((pEList->a[lVar23].pExpr)->flags & 2) != 0)) {
                    sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pbVar25);
                    return 2;
                  }
                  resolveAlias(pParse,pEList,(int)lVar23,pExpr,"",nSubquery);
                  uVar20 = pExpr->op;
                  if (uVar20 == '\x18') goto LAB_00186364;
                  goto LAB_0018629e;
                }
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != pEList->nExpr);
          }
          goto LAB_0018605d;
        }
LAB_00186103:
        bVar8 = false;
        goto LAB_00186105;
      }
LAB_0018605d:
      if (iVar12 != 0) goto LAB_00186103;
      local_78 = local_78->pNext;
      nSubquery = nSubquery + 1;
    } while (local_78 != (NameContext *)0x0);
    bVar8 = true;
LAB_00186105:
    uVar20 = '<';
    if (!bVar35) {
      uVar20 = 0x98;
    }
    bVar35 = zTab == (char *)0x0;
    bVar9 = iVar12 == 1;
    if ((bool)(bVar35 & bVar8)) goto LAB_0018615a;
    bVar9 = true;
    if (iVar12 != 1) {
      bVar9 = false;
      goto LAB_0018619a;
    }
  }
  uVar2 = pExpr->iColumn;
  if ((-1 < (short)uVar2) && (local_a8 != (SrcList_item *)0x0)) {
    uVar15 = 0x3f;
    if (uVar2 < 0x3f) {
      uVar15 = uVar2;
    }
    local_a8->colUsed = local_a8->colUsed | 1L << ((byte)uVar15 & 0x3f);
  }
  sqlite3ExprDelete(psVar3,pExpr->pLeft);
  pExpr->pLeft = (Expr *)0x0;
  sqlite3ExprDelete(psVar3,pExpr->pRight);
  pExpr->pRight = (Expr *)0x0;
  pExpr->op = uVar20;
  if (!bVar9) {
    return 2;
  }
LAB_0018629e:
  if ((local_70 != (Schema *)0x0) &&
     (psVar3 = pParse->db,
     psVar3->xAuth != (_func_int_void_ptr_int_char_ptr_char_ptr_char_ptr_char_ptr *)0x0)) {
    uVar31 = psVar3->nDb;
    if ((int)uVar31 < 1) {
      iVar13 = 0;
    }
    else {
      ppSVar24 = &psVar3->aDb->pSchema;
      uVar16 = 0;
      do {
        uVar17 = uVar16;
        if (*ppSVar24 == local_70) break;
        uVar16 = uVar16 + 1;
        ppSVar24 = ppSVar24 + 4;
        uVar17 = (ulong)uVar31;
      } while (uVar31 != uVar16);
      iVar13 = (int)uVar17;
      if (iVar13 < 0) goto LAB_00186364;
    }
    if (uVar20 == '<') {
      ppTVar14 = &pParse->pTriggerTab;
LAB_00186302:
      pTVar5 = *ppTVar14;
      if (pTVar5 != (Table *)0x0) {
        lVar23 = (long)pExpr->iColumn;
        if ((pExpr->iColumn < 0) && (lVar23 = (long)pTVar5->iPKey, lVar23 < 0)) {
          pcVar19 = "ROWID";
        }
        else {
          pcVar19 = pTVar5->aCol[lVar23].zName;
        }
        iVar13 = sqlite3AuthReadCol(pParse,pTVar5->zName,pcVar19,iVar13);
        if (iVar13 == 2) {
          pExpr->op = 'b';
        }
      }
    }
    else {
      lVar23 = (long)local_78->pSrcList->nSrc;
      if (0 < lVar23) {
        ppTVar14 = &local_78->pSrcList->a[0].pTab;
        do {
          if (pExpr->iTable == *(int *)((long)ppTVar14 + 0x1c)) goto LAB_00186302;
          ppTVar14 = ppTVar14 + 0xd;
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
    }
  }
LAB_00186364:
  pNC->nRef = pNC->nRef + 1;
  if (local_78 != pNC) {
    do {
      pNC = pNC->pNext;
      pNC->nRef = pNC->nRef + 1;
    } while (pNC != local_78);
  }
  return 1;
}

Assistant:

static int lookupName(
  Parse *pParse,       /* The parsing context */
  const char *zDb,     /* Name of the database containing table, or NULL */
  const char *zTab,    /* Name of table containing column, or NULL */
  const char *zCol,    /* Name of the column. */
  NameContext *pNC,    /* The name context used to resolve the name */
  Expr *pExpr          /* Make this EXPR node point to the selected column */
){
  int i, j;                         /* Loop counters */
  int cnt = 0;                      /* Number of matching column names */
  int cntTab = 0;                   /* Number of matching table names */
  int nSubquery = 0;                /* How many levels of subquery */
  sqlite3 *db = pParse->db;         /* The database connection */
  struct SrcList_item *pItem;       /* Use for looping over pSrcList items */
  struct SrcList_item *pMatch = 0;  /* The matching pSrcList item */
  NameContext *pTopNC = pNC;        /* First namecontext in the list */
  Schema *pSchema = 0;              /* Schema of the expression */
  int isTrigger = 0;

  assert( pNC );     /* the name context cannot be NULL. */
  assert( zCol );    /* The Z in X.Y.Z cannot be NULL */
  assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );

  /* Initialize the node to no-match */
  pExpr->iTable = -1;
  pExpr->pTab = 0;
  ExprSetIrreducible(pExpr);

  /* Translate the schema name in zDb into a pointer to the corresponding
  ** schema.  If not found, pSchema will remain NULL and nothing will match
  ** resulting in an appropriate error message toward the end of this routine
  */
  if( zDb ){
    for(i=0; i<db->nDb; i++){
      assert( db->aDb[i].zName );
      if( sqlite3StrICmp(db->aDb[i].zName,zDb)==0 ){
        pSchema = db->aDb[i].pSchema;
        break;
      }
    }
  }

  /* Start at the inner-most context and move outward until a match is found */
  while( pNC && cnt==0 ){
    ExprList *pEList;
    SrcList *pSrcList = pNC->pSrcList;

    if( pSrcList ){
      for(i=0, pItem=pSrcList->a; i<pSrcList->nSrc; i++, pItem++){
        Table *pTab;
        Column *pCol;
  
        pTab = pItem->pTab;
        assert( pTab!=0 && pTab->zName!=0 );
        assert( pTab->nCol>0 );
        if( pItem->pSelect && (pItem->pSelect->selFlags & SF_NestedFrom)!=0 ){
          int hit = 0;
          pEList = pItem->pSelect->pEList;
          for(j=0; j<pEList->nExpr; j++){
            if( sqlite3MatchSpanName(pEList->a[j].zSpan, zCol, zTab, zDb) ){
              cnt++;
              cntTab = 2;
              pMatch = pItem;
              pExpr->iColumn = j;
              hit = 1;
            }
          }
          if( hit || zTab==0 ) continue;
        }
        if( zDb && pTab->pSchema!=pSchema ){
          continue;
        }
        if( zTab ){
          const char *zTabName = pItem->zAlias ? pItem->zAlias : pTab->zName;
          assert( zTabName!=0 );
          if( sqlite3StrICmp(zTabName, zTab)!=0 ){
            continue;
          }
        }
        if( 0==(cntTab++) ){
          pMatch = pItem;
        }
        for(j=0, pCol=pTab->aCol; j<pTab->nCol; j++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            /* If there has been exactly one prior match and this match
            ** is for the right-hand table of a NATURAL JOIN or is in a 
            ** USING clause, then skip this match.
            */
            if( cnt==1 ){
              if( pItem->jointype & JT_NATURAL ) continue;
              if( nameInUsingClause(pItem->pUsing, zCol) ) continue;
            }
            cnt++;
            pMatch = pItem;
            /* Substitute the rowid (column -1) for the INTEGER PRIMARY KEY */
            pExpr->iColumn = j==pTab->iPKey ? -1 : (i16)j;
            break;
          }
        }
      }
      if( pMatch ){
        pExpr->iTable = pMatch->iCursor;
        pExpr->pTab = pMatch->pTab;
        pSchema = pExpr->pTab->pSchema;
      }
    } /* if( pSrcList ) */

#ifndef SQLITE_OMIT_TRIGGER
    /* If we have not already resolved the name, then maybe 
    ** it is a new.* or old.* trigger argument reference
    */
    if( zDb==0 && zTab!=0 && cnt==0 && pParse->pTriggerTab!=0 ){
      int op = pParse->eTriggerOp;
      Table *pTab = 0;
      assert( op==TK_DELETE || op==TK_UPDATE || op==TK_INSERT );
      if( op!=TK_DELETE && sqlite3StrICmp("new",zTab) == 0 ){
        pExpr->iTable = 1;
        pTab = pParse->pTriggerTab;
      }else if( op!=TK_INSERT && sqlite3StrICmp("old",zTab)==0 ){
        pExpr->iTable = 0;
        pTab = pParse->pTriggerTab;
      }

      if( pTab ){ 
        int iCol;
        pSchema = pTab->pSchema;
        cntTab++;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          Column *pCol = &pTab->aCol[iCol];
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            if( iCol==pTab->iPKey ){
              iCol = -1;
            }
            break;
          }
        }
        if( iCol>=pTab->nCol && sqlite3IsRowid(zCol) ){
          iCol = -1;        /* IMP: R-44911-55124 */
        }
        if( iCol<pTab->nCol ){
          cnt++;
          if( iCol<0 ){
            pExpr->affinity = SQLITE_AFF_INTEGER;
          }else if( pExpr->iTable==0 ){
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->oldmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }else{
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->newmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }
          pExpr->iColumn = (i16)iCol;
          pExpr->pTab = pTab;
          isTrigger = 1;
        }
      }
    }
#endif /* !defined(SQLITE_OMIT_TRIGGER) */

    /*
    ** Perhaps the name is a reference to the ROWID
    */
    if( cnt==0 && cntTab==1 && sqlite3IsRowid(zCol) ){
      cnt = 1;
      pExpr->iColumn = -1;     /* IMP: R-44911-55124 */
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }

    /*
    ** If the input is of the form Z (not Y.Z or X.Y.Z) then the name Z
    ** might refer to an result-set alias.  This happens, for example, when
    ** we are resolving names in the WHERE clause of the following command:
    **
    **     SELECT a+b AS x FROM table WHERE x<10;
    **
    ** In cases like this, replace pExpr with a copy of the expression that
    ** forms the result set entry ("a+b" in the example) and return immediately.
    ** Note that the expression in the result set should have already been
    ** resolved by the time the WHERE clause is resolved.
    */
    if( (pEList = pNC->pEList)!=0
     && zTab==0
     && ((pNC->ncFlags & NC_AsMaybe)==0 || cnt==0)
    ){
      for(j=0; j<pEList->nExpr; j++){
        char *zAs = pEList->a[j].zName;
        if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
          Expr *pOrig;
          assert( pExpr->pLeft==0 && pExpr->pRight==0 );
          assert( pExpr->x.pList==0 );
          assert( pExpr->x.pSelect==0 );
          pOrig = pEList->a[j].pExpr;
          if( (pNC->ncFlags&NC_AllowAgg)==0 && ExprHasProperty(pOrig, EP_Agg) ){
            sqlite3ErrorMsg(pParse, "misuse of aliased aggregate %s", zAs);
            return WRC_Abort;
          }
          resolveAlias(pParse, pEList, j, pExpr, "", nSubquery);
          cnt = 1;
          pMatch = 0;
          assert( zTab==0 && zDb==0 );
          goto lookupname_end;
        }
      } 
    }

    /* Advance to the next name context.  The loop will exit when either
    ** we have a match (cnt>0) or when we run out of name contexts.
    */
    if( cnt==0 ){
      pNC = pNC->pNext;
      nSubquery++;
    }
  }

  /*
  ** If X and Y are NULL (in other words if only the column name Z is
  ** supplied) and the value of Z is enclosed in double-quotes, then
  ** Z is a string literal if it doesn't match any column names.  In that
  ** case, we need to return right away and not make any changes to
  ** pExpr.
  **
  ** Because no reference was made to outer contexts, the pNC->nRef
  ** fields are not changed in any context.
  */
  if( cnt==0 && zTab==0 && ExprHasProperty(pExpr,EP_DblQuoted) ){
    pExpr->op = TK_STRING;
    pExpr->pTab = 0;
    return WRC_Prune;
  }

  /*
  ** cnt==0 means there was not match.  cnt>1 means there were two or
  ** more matches.  Either way, we have an error.
  */
  if( cnt!=1 ){
    const char *zErr;
    zErr = cnt==0 ? "no such column" : "ambiguous column name";
    if( zDb ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s.%s", zErr, zDb, zTab, zCol);
    }else if( zTab ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zErr, zTab, zCol);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zErr, zCol);
    }
    pParse->checkSchema = 1;
    pTopNC->nErr++;
  }

  /* If a column from a table in pSrcList is referenced, then record
  ** this fact in the pSrcList.a[].colUsed bitmask.  Column 0 causes
  ** bit 0 to be set.  Column 1 sets bit 1.  And so forth.  If the
  ** column number is greater than the number of bits in the bitmask
  ** then set the high-order bit of the bitmask.
  */
  if( pExpr->iColumn>=0 && pMatch!=0 ){
    int n = pExpr->iColumn;
    testcase( n==BMS-1 );
    if( n>=BMS ){
      n = BMS-1;
    }
    assert( pMatch->iCursor==pExpr->iTable );
    pMatch->colUsed |= ((Bitmask)1)<<n;
  }

  /* Clean up and return
  */
  sqlite3ExprDelete(db, pExpr->pLeft);
  pExpr->pLeft = 0;
  sqlite3ExprDelete(db, pExpr->pRight);
  pExpr->pRight = 0;
  pExpr->op = (isTrigger ? TK_TRIGGER : TK_COLUMN);
lookupname_end:
  if( cnt==1 ){
    assert( pNC!=0 );
    if( pExpr->op!=TK_AS ){
      sqlite3AuthRead(pParse, pExpr, pSchema, pNC->pSrcList);
    }
    /* Increment the nRef value on all name contexts from TopNC up to
    ** the point where the name matched. */
    for(;;){
      assert( pTopNC!=0 );
      pTopNC->nRef++;
      if( pTopNC==pNC ) break;
      pTopNC = pTopNC->pNext;
    }
    return WRC_Prune;
  } else {
    return WRC_Abort;
  }
}